

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O2

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  value_type vVar1;
  size_type sVar2;
  pointer puVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  DynamicPartialIndex *pDVar8;
  uint *nxt;
  pointer __x;
  vertex_t local_3c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_38;
  
  this->back_ = 0;
  this->front_ = 0;
  pDVar8 = (DynamicPartialIndex *)dist;
  local_3c = s;
  local_38 = graph;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if (*pvVar5 != '\0') {
    bVar4 = has_parent(pDVar8,s,reverse_graph,dist);
    if (!bVar4) {
      sVar2 = this->back_;
      this->back_ = sVar2 + 1;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
      *pvVar6 = s;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
      *pvVar5 = '?';
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this->updated_,&local_3c);
    }
  }
  while (sVar2 = this->front_, this->back_ != sVar2) {
    this->front_ = sVar2 + 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
    pvVar7 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(local_38,(ulong)*pvVar6);
    puVar3 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start; __x != puVar3; __x = __x + 1) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*__x);
      if (*pvVar5 != '?') {
        pDVar8 = (DynamicPartialIndex *)dist;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*__x);
        if (*pvVar5 != '\0') {
          bVar4 = has_parent(pDVar8,*__x,reverse_graph,dist);
          if (!bVar4) {
            vVar1 = *__x;
            sVar2 = this->back_;
            this->back_ = sVar2 + 1;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (this->queue_,sVar2);
            *pvVar6 = vVar1;
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (dist,(ulong)*__x);
            *pvVar5 = '?';
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this->updated_,__x);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::collect_changes(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
        queue_.at(back_++) = s;
        dist.at(s) = INF8;
        updated_.push_back(s);
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}